

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCec.c
# Opt level: O0

int Cec_ManVerifyNaive(Gia_Man_t *p,Cec_ParCec_t *pPars)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  abctime aVar4;
  ProgressBar *p_01;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  abctime aVar7;
  ProgressBar *pProgress;
  int RetValue;
  int status;
  int pLits [2];
  int iVar1;
  int iVar0;
  int i;
  int nTrivs;
  int nUndecs;
  int nSats;
  int nUnsats;
  int nPairs;
  abctime clkStart;
  Gia_Obj_t *pObj1;
  Gia_Obj_t *pObj0;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  Cec_ParCec_t *pPars_local;
  Gia_Man_t *p_local;
  
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  aVar4 = Abc_Clock();
  iVar2 = Gia_ManPoNum(p);
  iVar2 = iVar2 / 2;
  nUndecs = 0;
  nTrivs = 0;
  i = 0;
  iVar0 = 0;
  p_01 = Extra_ProgressBarStart(_stdout,iVar2);
  iVar3 = Gia_ManPoNum(p);
  if (iVar3 % 2 != 0) {
    __assert_fail("Gia_ManPoNum(p) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCec.c"
                  ,0xec,"int Cec_ManVerifyNaive(Gia_Man_t *, Cec_ParCec_t *)");
  }
  iVar1 = 0;
  do {
    if (iVar2 <= iVar1) {
LAB_007df1c8:
      Extra_ProgressBarStop(p_01);
      printf("UNSAT = %6d.  SAT = %6d.   UNDEC = %6d.  Trivial = %6d.  ",(ulong)(uint)nUndecs,
             (ulong)(uint)nTrivs,(ulong)(uint)i,(ulong)(uint)iVar0);
      aVar7 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar7 - aVar4);
      Cnf_DataFree(p_00);
      sat_solver_delete(s);
      if (nTrivs == 0) {
        if (i == 0) {
          p_local._4_4_ = 1;
        }
        else {
          p_local._4_4_ = -1;
        }
      }
      else {
        p_local._4_4_ = 0;
      }
      return p_local._4_4_;
    }
    if ((iVar1 & 0xffU) == 0) {
      Extra_ProgressBarUpdate(p_01,iVar1,(char *)0x0);
    }
    pObj = Gia_ManPo(p,iVar1 << 1);
    pObj_00 = Gia_ManPo(p,iVar1 * 2 + 1);
    pGVar5 = Gia_ObjChild0(pObj);
    pGVar6 = Gia_ObjChild0(pObj_00);
    if (pGVar5 == pGVar6) {
      nUndecs = nUndecs + 1;
      iVar0 = iVar0 + 1;
    }
    else {
      if (pPars->TimeLimit != 0) {
        aVar7 = Abc_Clock();
        if ((long)pPars->TimeLimit <= (aVar7 - aVar4) / 1000000) {
          printf("Timeout (%d sec) is reached.\n",(ulong)(uint)pPars->TimeLimit,
                 (aVar7 - aVar4) % 1000000);
          i = (iVar2 - nUndecs) - nTrivs;
          goto LAB_007df1c8;
        }
      }
      piVar1 = p_00->pVarNums;
      iVar3 = Gia_ObjId(p,pObj);
      pLits[1] = piVar1[iVar3];
      piVar1 = p_00->pVarNums;
      iVar3 = Gia_ObjId(p,pObj_00);
      pLits[0] = piVar1[iVar3];
      if ((pLits[1] < 0) || (pLits[0] < 0)) {
        __assert_fail("iVar0 >= 0 && iVar1 >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCec.c"
                      ,0x101,"int Cec_ManVerifyNaive(Gia_Man_t *, Cec_ParCec_t *)");
      }
      RetValue = Abc_Var2Lit(pLits[1],0);
      status = Abc_Var2Lit(pLits[0],0);
      RetValue = lit_neg(RetValue);
      iVar3 = sat_solver_solve(s,&RetValue,pLits,(long)pPars->nBTLimit,0,0,0);
      if (iVar3 == -1) {
        RetValue = lit_neg(RetValue);
        status = lit_neg(status);
        iVar3 = sat_solver_addclause(s,&RetValue,pLits);
        if (iVar3 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCec.c"
                        ,0x10c,"int Cec_ManVerifyNaive(Gia_Man_t *, Cec_ParCec_t *)");
        }
        iVar3 = sat_solver_solve(s,&RetValue,pLits,(long)pPars->nBTLimit,0,0,0);
        if (iVar3 == -1) {
          RetValue = lit_neg(RetValue);
          status = lit_neg(status);
          iVar3 = sat_solver_addclause(s,&RetValue,pLits);
          if (iVar3 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCec.c"
                          ,0x120,"int Cec_ManVerifyNaive(Gia_Man_t *, Cec_ParCec_t *)");
          }
          nUndecs = nUndecs + 1;
        }
        else if (iVar3 == 1) {
          printf("Output %d is SAT.\n",(ulong)(uint)iVar1);
          nTrivs = nTrivs + 1;
        }
        else {
          i = i + 1;
        }
      }
      else if (iVar3 == 1) {
        printf("Output %d is SAT.\n",(ulong)(uint)iVar1);
        nTrivs = nTrivs + 1;
      }
      else {
        i = i + 1;
      }
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

int Cec_ManVerifyNaive( Gia_Man_t * p, Cec_ParCec_t * pPars )
{
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    Gia_Obj_t * pObj0, * pObj1;
    abctime clkStart = Abc_Clock();
    int nPairs = Gia_ManPoNum(p)/2;
    int nUnsats = 0, nSats = 0, nUndecs = 0, nTrivs = 0;
    int i, iVar0, iVar1, pLits[2], status, RetValue;
    ProgressBar * pProgress = Extra_ProgressBarStart( stdout, nPairs );
    assert( Gia_ManPoNum(p) % 2 == 0 );
    for ( i = 0; i < nPairs; i++ )
    {
        if ( (i & 0xFF) == 0 )
            Extra_ProgressBarUpdate( pProgress, i, NULL );
        pObj0 = Gia_ManPo(p, 2*i);
        pObj1 = Gia_ManPo(p, 2*i+1);
        if ( Gia_ObjChild0(pObj0) == Gia_ObjChild0(pObj1) )
        {
            nUnsats++;
            nTrivs++;
            continue;
        }
        if ( pPars->TimeLimit && (Abc_Clock() - clkStart)/CLOCKS_PER_SEC >= pPars->TimeLimit )
        {
            printf( "Timeout (%d sec) is reached.\n", pPars->TimeLimit );
            nUndecs = nPairs - nUnsats - nSats;
            break;
        }
        iVar0 = pCnf->pVarNums[ Gia_ObjId(p, pObj0) ];
        iVar1 = pCnf->pVarNums[ Gia_ObjId(p, pObj1) ];
        assert( iVar0 >= 0 && iVar1 >= 0 );
        pLits[0] = Abc_Var2Lit( iVar0, 0 );
        pLits[1] = Abc_Var2Lit( iVar1, 0 );
        // check direct
        pLits[0] = lit_neg(pLits[0]);
        status = sat_solver_solve( pSat, pLits, pLits + 2, pPars->nBTLimit, 0, 0, 0 );
        if ( status == l_False )
        {
            pLits[0] = lit_neg( pLits[0] );
            pLits[1] = lit_neg( pLits[1] );
            RetValue = sat_solver_addclause( pSat, pLits, pLits + 2 );
            assert( RetValue );
        }
        else if ( status == l_True )
        {
            printf( "Output %d is SAT.\n", i );
            nSats++;
            continue;
        }
        else
        {
            nUndecs++;
            continue;
        }
        // check inverse
        status = sat_solver_solve( pSat, pLits, pLits + 2, pPars->nBTLimit, 0, 0, 0 );
        if ( status == l_False )
        {
            pLits[0] = lit_neg( pLits[0] );
            pLits[1] = lit_neg( pLits[1] );
            RetValue = sat_solver_addclause( pSat, pLits, pLits + 2 );
            assert( RetValue );
        }
        else if ( status == l_True )
        {
            printf( "Output %d is SAT.\n", i );
            nSats++;
            continue;
        }
        else
        {
            nUndecs++;
            continue;
        }
        nUnsats++;
    }
    Extra_ProgressBarStop( pProgress );
    printf( "UNSAT = %6d.  SAT = %6d.   UNDEC = %6d.  Trivial = %6d.  ", nUnsats, nSats, nUndecs, nTrivs );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    if ( nSats )
        return 0;
    if ( nUndecs )
        return -1;
    return 1;
}